

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O0

void nh_server_listen(nh_server_t *server,char *ip,int port)

{
  int iVar1;
  undefined1 local_30 [8];
  epoll_event ev;
  int flags;
  int flag;
  int port_local;
  char *ip_local;
  nh_server_t *server_local;
  
  signal(0xd,(__sighandler_t)0x1);
  iVar1 = socket(2,1,0);
  server->socket = iVar1;
  ev.data.u64._4_4_ = 1;
  setsockopt(server->socket,1,0xf,(void *)((long)&ev.data + 4),4);
  nh_server_bind(server->socket,&server->addr,ip,port);
  server->addr_len = 0x10;
  ev.data.fd = fcntl(server->socket,3,0);
  fcntl(server->socket,4,(ulong)(ev.data.u32 | 0x800));
  listen(server->socket,0x80);
  local_30._0_4_ = 0x80000001;
  unique0x10000120 = server;
  epoll_ctl(server->loop,1,server->socket,(epoll_event *)local_30);
  return;
}

Assistant:

void nh_server_listen(nh_server_t *server, char const *ip, int port) {
    // socket init
    signal(SIGPIPE, SIG_IGN);
    server->socket = socket(AF_INET, SOCK_STREAM, 0);
    int flag = 1;
    setsockopt(server->socket, SOL_SOCKET, SO_REUSEPORT, &flag, sizeof(flag));
    // bind
    nh_server_bind(server->socket, &server->addr, ip, port);
    // listen
    server->addr_len = sizeof(server->addr);
    int flags = fcntl(server->socket, F_GETFL, 0);
    fcntl(server->socket, F_SETFL, flags | O_NONBLOCK);
    listen(server->socket, 128);
    // epoll event
    struct epoll_event ev;
    ev.events = EPOLLIN | EPOLLET;
    ev.data.ptr = server;
    epoll_ctl(server->loop, EPOLL_CTL_ADD, server->socket, &ev);
}